

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall LogicalOperationNode::Evaluate(LogicalOperationNode *this,Date *date,string *event)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  byte local_3a;
  byte local_39;
  string *event_local;
  Date *date_local;
  LogicalOperationNode *this_local;
  
  if (this->operation == And) {
    peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->lhs_node);
    uVar1 = (**peVar3->_vptr_Node)(peVar3,date,event);
    local_39 = 0;
    if ((uVar1 & 1) != 0) {
      peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->rhs_node);
      iVar2 = (**peVar3->_vptr_Node)(peVar3,date,event);
      local_39 = (byte)iVar2;
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  else if (this->operation == Or) {
    peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->lhs_node);
    uVar1 = (**peVar3->_vptr_Node)(peVar3,date,event);
    local_3a = 1;
    if ((uVar1 & 1) == 0) {
      peVar3 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->rhs_node);
      iVar2 = (**peVar3->_vptr_Node)(peVar3,date,event);
      local_3a = (byte)iVar2;
    }
    this_local._7_1_ = (bool)(local_3a & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LogicalOperationNode::Evaluate(const Date &date, const string &event) const {
    switch (operation) {
        case And:
            return lhs_node->Evaluate(date,event) && rhs_node->Evaluate(date,event);
        case Or:
            return lhs_node->Evaluate(date,event) || rhs_node->Evaluate(date,event);
    }
    return true; // unreachable
}